

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

_Bool Curl_auth_digest_get_pair(char *str,char *value,char *content,char **endptr)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  
  lVar5 = 0;
  for (lVar7 = 0; ((cVar1 = str[lVar7], cVar1 != '\0' && (cVar1 != '=')) && ((int)lVar7 != 0xff));
      lVar7 = lVar7 + 1) {
    value[lVar7] = cVar1;
    lVar5 = lVar5 + -1;
  }
  value[lVar7] = '\0';
  cVar1 = str[lVar7];
  if (cVar1 == '=') {
    cVar2 = str[lVar7 + 1];
    pcVar4 = str + 2;
    if (cVar2 != '\"') {
      pcVar4 = str + 1;
    }
    pcVar4 = pcVar4 + -lVar5;
    iVar6 = 0x3ff;
    bVar3 = false;
    while ((cVar8 = *pcVar4, cVar8 != '\0' && (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9))) {
      if ((cVar8 == '\n') || (cVar8 == '\r')) {
LAB_003b76a0:
        iVar6 = 0;
      }
      else {
        if (cVar8 == '\"') {
          if (cVar2 == '\"' && !bVar3) goto LAB_003b76a0;
LAB_003b76b6:
          bVar3 = false;
        }
        else {
          if (cVar8 == ',') {
            if (cVar2 != '\"') goto LAB_003b76a0;
            goto LAB_003b76b6;
          }
          if ((cVar8 != '\\') || (bVar3)) goto LAB_003b76b6;
          bVar3 = true;
          cVar8 = '\\';
        }
        *content = cVar8;
        content = content + 1;
      }
      pcVar4 = pcVar4 + 1;
    }
    *content = '\0';
    *endptr = pcVar4;
  }
  return cVar1 == '=';
}

Assistant:

bool Curl_auth_digest_get_pair(const char *str, char *value, char *content,
                               const char **endptr)
{
  int c;
  bool starts_with_quote = FALSE;
  bool escape = FALSE;

  for(c = DIGEST_MAX_VALUE_LENGTH - 1; (*str && (*str != '=') && c--);)
    *value++ = *str++;
  *value = 0;

  if('=' != *str++)
    /* eek, no match */
    return FALSE;

  if('\"' == *str) {
    /* This starts with a quote so it must end with one as well! */
    str++;
    starts_with_quote = TRUE;
  }

  for(c = DIGEST_MAX_CONTENT_LENGTH - 1; *str && c--; str++) {
    switch(*str) {
    case '\\':
      if(!escape) {
        /* possibly the start of an escaped quote */
        escape = TRUE;
        *content++ = '\\'; /* Even though this is an escape character, we still
                              store it as-is in the target buffer */
        continue;
      }
      break;

    case ',':
      if(!starts_with_quote) {
        /* This signals the end of the content if we didn't get a starting
           quote and then we do "sloppy" parsing */
        c = 0; /* the end */
        continue;
      }
      break;

    case '\r':
    case '\n':
      /* end of string */
      c = 0;
      continue;

    case '\"':
      if(!escape && starts_with_quote) {
        /* end of string */
        c = 0;
        continue;
      }
      break;
    }

    escape = FALSE;
    *content++ = *str;
  }

  *content = 0;
  *endptr = str;

  return TRUE;
}